

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t archive_compressor_compress_close(archive_write_filter *f)

{
  void *pvVar1;
  wchar_t ret;
  private_data_conflict4 *state;
  archive_write_filter *f_local;
  
  pvVar1 = f->data;
  f_local._4_4_ = output_code(f,*(wchar_t *)((long)pvVar1 + 0x65164));
  if ((f_local._4_4_ == L'\0') && (f_local._4_4_ = output_flush(f), f_local._4_4_ == L'\0')) {
    f_local._4_4_ =
         __archive_write_filter
                   (f->next_filter,*(void **)((long)pvVar1 + 0x65178),
                    *(size_t *)((long)pvVar1 + 0x65188));
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		return ret;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		return ret;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
	return (ret);
}